

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O0

void __thiscall
miniros::MasterLink::paramUpdateCallback(MasterLink *this,RpcValue *params,RpcValue *result)

{
  string *psVar1;
  string *in_RDI;
  RpcValue *in_stack_00000040;
  string *in_stack_00000048;
  MasterLink *in_stack_00000050;
  int in_stack_ffffffffffffff4c;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  undefined4 uVar2;
  XmlRpcValue *this_00;
  int *in_stack_ffffffffffffff78;
  XmlRpcValue *in_stack_ffffffffffffff80;
  XmlRpcValue *in_stack_ffffffffffffff88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  undefined1 local_51 [53];
  undefined4 local_1c;
  
  local_1c = 1;
  XmlRpc::XmlRpcValue::operator[]
            ((XmlRpcValue *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             in_stack_ffffffffffffff4c);
  XmlRpc::XmlRpcValue::operator=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  this_00 = (XmlRpcValue *)local_51;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffff90,(char *)in_stack_ffffffffffffff88,
             (allocator<char> *)in_stack_ffffffffffffff80);
  XmlRpc::XmlRpcValue::XmlRpcValue(this_00,in_RDI);
  XmlRpc::XmlRpcValue::operator[]
            ((XmlRpcValue *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50),
             in_stack_ffffffffffffff4c);
  XmlRpc::XmlRpcValue::operator=((XmlRpcValue *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88)
  ;
  XmlRpc::XmlRpcValue::~XmlRpcValue((XmlRpcValue *)0x45e62b);
  std::__cxx11::string::~string((string *)(local_51 + 1));
  std::allocator<char>::~allocator((allocator<char> *)local_51);
  uVar2 = 2;
  XmlRpc::XmlRpcValue::operator[]
            ((XmlRpcValue *)CONCAT44(2,in_stack_ffffffffffffff50),in_stack_ffffffffffffff4c);
  XmlRpc::XmlRpcValue::operator=(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  XmlRpc::XmlRpcValue::operator[]
            ((XmlRpcValue *)CONCAT44(uVar2,in_stack_ffffffffffffff50),in_stack_ffffffffffffff4c);
  psVar1 = XmlRpc::XmlRpcValue::operator_cast_to_string_
                     ((XmlRpcValue *)CONCAT44(uVar2,in_stack_ffffffffffffff50));
  std::__cxx11::string::string((string *)&stack0xffffffffffffff78,(string *)psVar1);
  XmlRpc::XmlRpcValue::operator[]
            ((XmlRpcValue *)CONCAT44(uVar2,in_stack_ffffffffffffff50),in_stack_ffffffffffffff4c);
  update(in_stack_00000050,in_stack_00000048,in_stack_00000040);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff78);
  return;
}

Assistant:

void MasterLink::paramUpdateCallback(const RpcValue& params, RpcValue& result)
{
  result[0] = 1;
  result[1] = std::string("");
  result[2] = 0;

  this->update((std::string)params[1], params[2]);
}